

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool WindowedKeyTest<Blob<450>,Blob<224>>
               (hashfunc<Blob<224>_> hash,int windowbits,bool testCollision,bool testDistribution,
               bool drawDiagram)

{
  pfHash p_Var1;
  reference pvVar2;
  byte in_CL;
  byte in_DL;
  uint in_ESI;
  byte in_R8B;
  bool in_stack_0000003b;
  bool in_stack_0000003c;
  bool in_stack_0000003d;
  bool in_stack_0000003e;
  bool in_stack_0000003f;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_00000040;
  int i;
  Blob<450> key;
  int minbit;
  int j;
  int testcount;
  bool result;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  int keycount;
  int keybits;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *this;
  size_type in_stack_ffffffffffffff38;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffff40;
  int local_8c;
  Blob<450> local_85;
  uint local_4c;
  uint local_48;
  int local_44;
  byte local_3d;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_30;
  uint local_18;
  undefined4 local_14;
  byte local_f;
  byte local_e;
  byte local_d;
  uint local_c;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_14 = 0x1c8;
  local_18 = 1 << (in_ESI & 0x1f);
  this = &local_30;
  local_c = in_ESI;
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x185dcd);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::resize
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_3d = 1;
  local_44 = 0x1c8;
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x1c8,
         (ulong)local_c,0x1c8,(ulong)local_18);
  for (local_48 = 0; (int)local_48 <= local_44; local_48 = local_48 + 1) {
    local_4c = local_48;
    Blob<450>::Blob(&local_85);
    for (local_8c = 0; local_8c < (int)local_18; local_8c = local_8c + 1) {
      Blob<450>::Blob((Blob<450> *)&stack0xffffffffffffff3b,local_8c);
      Blob<450>::operator=(&local_85,(Blob<450> *)&stack0xffffffffffffff3b);
      lrot((void *)CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
           in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
      p_Var1 = hashfunc::operator_cast_to_function_pointer(local_8);
      pvVar2 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[]
                         (&local_30,(long)local_8c);
      (*p_Var1)(&local_85,0x39,0,pvVar2);
    }
    printf("Window at %3d - ",(ulong)local_48);
    in_stack_ffffffffffffff27 =
         TestHashList<Blob<224>>
                   (in_stack_00000040,in_stack_0000003f,in_stack_0000003e,in_stack_0000003d,
                    in_stack_0000003c,in_stack_0000003b);
    local_3d = (local_3d & 1 & in_stack_ffffffffffffff27) != 0;
  }
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector(this);
  return (bool)(local_3d & 1);
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, const int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  const int keycount = 1 << windowbits;

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;

  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;

    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;

      lrot(&key,sizeof(keytype),minbit);

      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);

    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);

    //printf("\n");
  }

  return result;
}